

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

string * __thiscall
ImgfsFile::nameinfo::name_abi_cxx11_(string *__return_storage_ptr__,nameinfo *this,ImgfsFile *imgfs)

{
  ImgfsFile *this_00;
  uint uVar1;
  ulong uVar2;
  size_t __n;
  element_type *peVar3;
  reference pvVar4;
  size_type sVar5;
  string local_130;
  undefined1 local_110 [24];
  Wstring wstr;
  string local_d0;
  undefined1 local_b0 [8];
  NameEntry ent;
  undefined1 local_60 [40];
  undefined1 local_38 [8];
  ByteVector entdata;
  ImgfsFile *imgfs_local;
  nameinfo *this_local;
  
  entdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)imgfs;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    if ((this->_flags & 2) == 0) {
      this_00 = (ImgfsFile *)((long)&wstr.field_2 + 8);
      ImgfsFile::rd(this_00);
      peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
      (*peVar3->_vptr_ReadWriter[4])(peVar3,(ulong)this->_ptr);
      std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)((long)&wstr.field_2 + 8));
      std::__cxx11::
      basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
      ::basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                      *)(local_110 + 0x10));
      ImgfsFile::rd((ImgfsFile *)local_110);
      readutf16le<std::shared_ptr<ReadWriter>>
                ((shared_ptr<ReadWriter> *)local_110,(Wstring *)(local_110 + 0x10),
                 (ulong)this->_length);
      std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_110);
      ToString<unsigned_short>
                (&local_130,
                 (basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                  *)(local_110 + 0x10));
      std::__cxx11::string::operator=((string *)&this->_name,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::
      basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
      ::~basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                       *)(local_110 + 0x10));
    }
    else {
      __n = direntsize((ImgfsFile *)
                       entdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)(local_60 + 0x27));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,__n,
                 (allocator<unsigned_char> *)(local_60 + 0x27));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)(local_60 + 0x27));
      ImgfsFile::rd((ImgfsFile *)local_60);
      peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_60);
      (*peVar3->_vptr_ReadWriter[4])(peVar3,(ulong)this->_ptr);
      std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_60);
      ImgfsFile::rd((ImgfsFile *)((long)&ent._name.field_2 + 8));
      peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(ent._name.field_2._M_local_buf + 8));
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
      (*peVar3->_vptr_ReadWriter[2])(peVar3,pvVar4,sVar5);
      std::shared_ptr<ReadWriter>::~shared_ptr
                ((shared_ptr<ReadWriter> *)((long)&ent._name.field_2 + 8));
      uVar1 = this->_ptr;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
      NameEntry::NameEntry((NameEntry *)local_b0,(ulong)uVar1,pvVar4,(ulong)this->_length);
      NameEntry::name_abi_cxx11_(&local_d0,(NameEntry *)local_b0);
      std::__cxx11::string::operator=((string *)&this->_name,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      NameEntry::~NameEntry((NameEntry *)local_b0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_name);
  return __return_storage_ptr__;
}

Assistant:

std::string name(ImgfsFile& imgfs)
        {
            if (_name.empty()) {
                if (_flags&2) {
                    ByteVector entdata(imgfs.direntsize());
                    imgfs.rd()->setpos(_ptr);
                    imgfs.rd()->read(&entdata[0], entdata.size());
                    NameEntry ent(_ptr, &entdata[0], _length);
                    _name= ent.name();
                }
                else {
                    imgfs.rd()->setpos(_ptr);

                    std::Wstring wstr;
                    readutf16le(imgfs.rd(), wstr, _length);

                    _name= ToString(wstr);
                }
            }
            return _name;
        }